

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  uint *puVar1;
  long lVar2;
  float *pfVar3;
  int iVar4;
  size_t sVar5;
  float **ppfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar28;
  int iVar29;
  int iVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  ulong uVar36;
  size_t sVar37;
  ulong uVar38;
  Scene *pSVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  long lVar43;
  ulong unaff_R12;
  size_t mask;
  ulong uVar44;
  uint *puVar45;
  long lVar46;
  float fVar47;
  uint uVar48;
  float fVar49;
  float fVar66;
  float fVar69;
  vint4 bi;
  uint uVar67;
  uint uVar70;
  float fVar71;
  uint uVar72;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar68;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar65;
  float fVar73;
  int iVar82;
  int iVar85;
  vint4 bi_1;
  float fVar83;
  float fVar84;
  int iVar86;
  float fVar87;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar88;
  uint uVar89;
  float fVar90;
  float fVar92;
  float fVar94;
  float fVar95;
  vint4 ai;
  uint uVar93;
  uint uVar96;
  float fVar97;
  uint uVar98;
  StackItemT<embree::NodeRefPtr<4>_> SVar91;
  float fVar99;
  float fVar100;
  float fVar101;
  undefined8 uVar102;
  float fVar112;
  vint4 ai_1;
  StackItemT<embree::NodeRefPtr<4>_> SVar103;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar113;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar104;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar114;
  float fVar115;
  float fVar120;
  float fVar122;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar121;
  float fVar123;
  undefined1 auVar119 [16];
  float fVar124;
  float fVar125;
  float fVar130;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar128;
  float fVar131;
  undefined1 auVar129 [16];
  float fVar132;
  float fVar141;
  float fVar143;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar133;
  float fVar142;
  float fVar144;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar145;
  float fVar148;
  float fVar149;
  float fVar150;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar151;
  float fVar154;
  float fVar155;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 auVar167 [16];
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  StackItemT<embree::NodeRefPtr<4>_> *local_1320;
  vbool<4> valid;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined4 local_12cc;
  undefined4 local_12c8;
  undefined4 uStack_12c4;
  float fStack_12c0;
  float fStack_12bc;
  undefined8 local_12b8;
  float fStack_12b0;
  float fStack_12ac;
  undefined8 local_12a8;
  float fStack_12a0;
  float fStack_129c;
  undefined8 local_1298;
  undefined8 uStack_1290;
  RTCFilterFunctionNArguments args;
  float fStack_1240;
  float fStack_123c;
  float fStack_1230;
  float fStack_122c;
  float fStack_1200;
  float fStack_11fc;
  float fStack_11f0;
  float fStack_11ec;
  float local_11d8;
  float fStack_11d4;
  float fStack_11d0;
  vfloat<4> tNear;
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  float local_1108 [4];
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined1 local_10e8 [8];
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8 [4];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [8];
  float fStack_10a0;
  float fStack_109c;
  undefined1 local_1098 [16];
  undefined4 local_1088;
  undefined4 uStack_1084;
  undefined4 uStack_1080;
  undefined4 uStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  uint local_1048;
  uint uStack_1044;
  uint uStack_1040;
  uint uStack_103c;
  uint local_1038;
  uint uStack_1034;
  uint uStack_1030;
  uint uStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  int local_fa8;
  int iStack_fa4;
  int iStack_fa0;
  int iStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 auVar136 [16];
  
  local_1320 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  local_fb8 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_fc8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_fd8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_fe8 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_ff8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_f98 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fStack_f94 = local_f98;
  fStack_f90 = local_f98;
  fStack_f8c = local_f98;
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar44 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar40 = uVar41 ^ 0x10;
  uVar34 = uVar38 ^ 0x10;
  local_fa8 = (tray->tnear).field_0.i[k];
  iVar30 = (tray->tfar).field_0.i[k];
  iStack_fa4 = local_fa8;
  iStack_fa0 = local_fa8;
  iStack_f9c = local_fa8;
  local_1008 = mm_lookupmask_ps._0_8_;
  uStack_1000 = mm_lookupmask_ps._8_8_;
  local_1018 = mm_lookupmask_ps._240_8_;
  uStack_1010 = mm_lookupmask_ps._248_8_;
  lVar35 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
  fStack_fb4 = local_fb8;
  fStack_fb0 = local_fb8;
  fStack_fac = local_fb8;
  fStack_fc4 = local_fc8;
  fStack_fc0 = local_fc8;
  fStack_fbc = local_fc8;
  fStack_fd4 = local_fd8;
  fStack_fd0 = local_fd8;
  fStack_fcc = local_fd8;
  fStack_fe4 = local_fe8;
  fStack_fe0 = local_fe8;
  fStack_fdc = local_fe8;
  fStack_ff4 = local_ff8;
  fStack_ff0 = local_ff8;
  fStack_fec = local_ff8;
  iVar82 = iVar30;
  iVar85 = iVar30;
  iVar86 = iVar30;
  fVar150 = local_fe8;
  fVar170 = local_fe8;
  fVar133 = local_fe8;
  fVar142 = local_fe8;
  fVar164 = local_ff8;
  fVar73 = local_ff8;
  fVar90 = local_ff8;
  fVar125 = local_ff8;
  fVar115 = local_fc8;
  fVar175 = local_fc8;
  fVar49 = local_fc8;
  fVar165 = local_fc8;
  fVar83 = local_fd8;
  fVar94 = local_fd8;
  fVar131 = local_fd8;
  fVar121 = local_fd8;
  fVar176 = local_fb8;
  fVar111 = local_fb8;
  fVar179 = local_fb8;
  fVar68 = local_fb8;
  do {
    do {
      do {
        if (local_1320 == stack) {
          return;
        }
        pSVar28 = local_1320 + -1;
        local_1320 = local_1320 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar28->dist &&
               (float)pSVar28->dist != *(float *)(ray + k * 4 + 0x80));
      sVar37 = (local_1320->ptr).ptr;
      do {
        if ((sVar37 & 8) == 0) {
          pfVar3 = (float *)(sVar37 + 0x20 + uVar41);
          fVar47 = (*pfVar3 - fVar176) * fVar150;
          fVar66 = (pfVar3[1] - fVar111) * fVar170;
          fVar69 = (pfVar3[2] - fVar179) * fVar133;
          fVar71 = (pfVar3[3] - fVar68) * fVar142;
          pfVar3 = (float *)(sVar37 + 0x20 + uVar44);
          fVar88 = (*pfVar3 - fVar115) * fVar164;
          fVar92 = (pfVar3[1] - fVar175) * fVar73;
          fVar95 = (pfVar3[2] - fVar49) * fVar90;
          fVar97 = (pfVar3[3] - fVar165) * fVar125;
          uVar89 = (uint)((int)fVar88 < (int)fVar47) * (int)fVar47 |
                   (uint)((int)fVar88 >= (int)fVar47) * (int)fVar88;
          uVar93 = (uint)((int)fVar92 < (int)fVar66) * (int)fVar66 |
                   (uint)((int)fVar92 >= (int)fVar66) * (int)fVar92;
          uVar96 = (uint)((int)fVar95 < (int)fVar69) * (int)fVar69 |
                   (uint)((int)fVar95 >= (int)fVar69) * (int)fVar95;
          uVar98 = (uint)((int)fVar97 < (int)fVar71) * (int)fVar71 |
                   (uint)((int)fVar97 >= (int)fVar71) * (int)fVar97;
          pfVar3 = (float *)(sVar37 + 0x20 + uVar38);
          fVar47 = (*pfVar3 - fVar83) * local_f98;
          fVar66 = (pfVar3[1] - fVar94) * fStack_f94;
          fVar69 = (pfVar3[2] - fVar131) * fStack_f90;
          fVar71 = (pfVar3[3] - fVar121) * fStack_f8c;
          uVar48 = (uint)((int)fVar47 < local_fa8) * local_fa8 |
                   (uint)((int)fVar47 >= local_fa8) * (int)fVar47;
          uVar67 = (uint)((int)fVar66 < iStack_fa4) * iStack_fa4 |
                   (uint)((int)fVar66 >= iStack_fa4) * (int)fVar66;
          uVar70 = (uint)((int)fVar69 < iStack_fa0) * iStack_fa0 |
                   (uint)((int)fVar69 >= iStack_fa0) * (int)fVar69;
          uVar72 = (uint)((int)fVar71 < iStack_f9c) * iStack_f9c |
                   (uint)((int)fVar71 >= iStack_f9c) * (int)fVar71;
          tNear.field_0.i[0] =
               ((int)uVar48 < (int)uVar89) * uVar89 | ((int)uVar48 >= (int)uVar89) * uVar48;
          tNear.field_0.i[1] =
               ((int)uVar67 < (int)uVar93) * uVar93 | ((int)uVar67 >= (int)uVar93) * uVar67;
          tNear.field_0.i[2] =
               ((int)uVar70 < (int)uVar96) * uVar96 | ((int)uVar70 >= (int)uVar96) * uVar70;
          tNear.field_0.i[3] =
               ((int)uVar72 < (int)uVar98) * uVar98 | ((int)uVar72 >= (int)uVar98) * uVar72;
          pfVar3 = (float *)(sVar37 + 0x20 + uVar40);
          fVar47 = (*pfVar3 - fVar176) * fVar150;
          fVar66 = (pfVar3[1] - fVar111) * fVar170;
          fVar69 = (pfVar3[2] - fVar179) * fVar133;
          fVar71 = (pfVar3[3] - fVar68) * fVar142;
          pfVar3 = (float *)(sVar37 + 0x20 + (uVar44 ^ 0x10));
          fVar88 = (*pfVar3 - fVar115) * fVar164;
          fVar92 = (pfVar3[1] - fVar175) * fVar73;
          fVar95 = (pfVar3[2] - fVar49) * fVar90;
          fVar97 = (pfVar3[3] - fVar165) * fVar125;
          uVar89 = (uint)((int)fVar47 < (int)fVar88) * (int)fVar47 |
                   (uint)((int)fVar47 >= (int)fVar88) * (int)fVar88;
          uVar93 = (uint)((int)fVar66 < (int)fVar92) * (int)fVar66 |
                   (uint)((int)fVar66 >= (int)fVar92) * (int)fVar92;
          uVar96 = (uint)((int)fVar69 < (int)fVar95) * (int)fVar69 |
                   (uint)((int)fVar69 >= (int)fVar95) * (int)fVar95;
          uVar98 = (uint)((int)fVar71 < (int)fVar97) * (int)fVar71 |
                   (uint)((int)fVar71 >= (int)fVar97) * (int)fVar97;
          pfVar3 = (float *)(sVar37 + 0x20 + uVar34);
          fVar47 = (*pfVar3 - fVar83) * local_f98;
          fVar66 = (pfVar3[1] - fVar94) * fStack_f94;
          fVar69 = (pfVar3[2] - fVar131) * fStack_f90;
          fVar71 = (pfVar3[3] - fVar121) * fStack_f8c;
          uVar48 = (uint)(iVar30 < (int)fVar47) * iVar30 |
                   (uint)(iVar30 >= (int)fVar47) * (int)fVar47;
          uVar67 = (uint)(iVar82 < (int)fVar66) * iVar82 |
                   (uint)(iVar82 >= (int)fVar66) * (int)fVar66;
          uVar70 = (uint)(iVar85 < (int)fVar69) * iVar85 |
                   (uint)(iVar85 >= (int)fVar69) * (int)fVar69;
          uVar72 = (uint)(iVar86 < (int)fVar71) * iVar86 |
                   (uint)(iVar86 >= (int)fVar71) * (int)fVar71;
          auVar139._0_4_ =
               -(uint)((int)(((int)uVar89 < (int)uVar48) * uVar89 |
                            ((int)uVar89 >= (int)uVar48) * uVar48) < tNear.field_0.i[0]);
          auVar139._4_4_ =
               -(uint)((int)(((int)uVar93 < (int)uVar67) * uVar93 |
                            ((int)uVar93 >= (int)uVar67) * uVar67) < tNear.field_0.i[1]);
          auVar139._8_4_ =
               -(uint)((int)(((int)uVar96 < (int)uVar70) * uVar96 |
                            ((int)uVar96 >= (int)uVar70) * uVar70) < tNear.field_0.i[2]);
          auVar139._12_4_ =
               -(uint)((int)(((int)uVar98 < (int)uVar72) * uVar98 |
                            ((int)uVar98 >= (int)uVar72) * uVar72) < tNear.field_0.i[3]);
          uVar48 = movmskps((int)uVar34,auVar139);
          unaff_R12 = ((ulong)uVar48 ^ 0xf) & 0xff;
        }
        if ((sVar37 & 8) == 0) {
          if (unaff_R12 == 0) {
            iVar29 = 4;
          }
          else {
            uVar36 = sVar37 & 0xfffffffffffffff0;
            lVar43 = 0;
            if (unaff_R12 != 0) {
              for (; (unaff_R12 >> lVar43 & 1) == 0; lVar43 = lVar43 + 1) {
              }
            }
            iVar29 = 0;
            sVar37 = *(size_t *)(uVar36 + lVar43 * 8);
            uVar42 = unaff_R12 - 1 & unaff_R12;
            if (uVar42 != 0) {
              uVar48 = tNear.field_0.i[lVar43];
              lVar43 = 0;
              if (uVar42 != 0) {
                for (; (uVar42 >> lVar43 & 1) == 0; lVar43 = lVar43 + 1) {
                }
              }
              sVar5 = *(size_t *)(uVar36 + lVar43 * 8);
              uVar67 = tNear.field_0.i[lVar43];
              uVar42 = uVar42 - 1 & uVar42;
              if (uVar42 == 0) {
                if (uVar48 < uVar67) {
                  (local_1320->ptr).ptr = sVar5;
                  local_1320->dist = uVar67;
                  local_1320 = local_1320 + 1;
                }
                else {
                  (local_1320->ptr).ptr = sVar37;
                  local_1320->dist = uVar48;
                  sVar37 = sVar5;
                  local_1320 = local_1320 + 1;
                }
              }
              else {
                auVar147._8_4_ = uVar48;
                auVar147._0_8_ = sVar37;
                auVar147._12_4_ = 0;
                auVar127._8_4_ = uVar67;
                auVar127._0_8_ = sVar5;
                auVar127._12_4_ = 0;
                lVar43 = 0;
                if (uVar42 != 0) {
                  for (; (uVar42 >> lVar43 & 1) == 0; lVar43 = lVar43 + 1) {
                  }
                }
                uVar102 = *(undefined8 *)(uVar36 + lVar43 * 8);
                iVar4 = tNear.field_0.i[lVar43];
                auVar135._8_4_ = iVar4;
                auVar135._0_8_ = uVar102;
                auVar135._12_4_ = 0;
                auVar118._8_4_ = -(uint)((int)uVar48 < (int)uVar67);
                uVar42 = uVar42 - 1 & uVar42;
                if (uVar42 == 0) {
                  auVar118._4_4_ = auVar118._8_4_;
                  auVar118._0_4_ = auVar118._8_4_;
                  auVar118._12_4_ = auVar118._8_4_;
                  auVar116._8_4_ = uVar67;
                  auVar116._0_8_ = sVar5;
                  auVar116._12_4_ = 0;
                  auVar117 = blendvps(auVar116,auVar147,auVar118);
                  auVar139 = blendvps(auVar147,auVar127,auVar118);
                  auVar50._8_4_ = -(uint)(auVar117._8_4_ < iVar4);
                  auVar50._4_4_ = auVar50._8_4_;
                  auVar50._0_4_ = auVar50._8_4_;
                  auVar50._12_4_ = auVar50._8_4_;
                  auVar126._8_4_ = iVar4;
                  auVar126._0_8_ = uVar102;
                  auVar126._12_4_ = 0;
                  auVar127 = blendvps(auVar126,auVar117,auVar50);
                  auVar147 = blendvps(auVar117,auVar135,auVar50);
                  auVar51._8_4_ = -(uint)(auVar139._8_4_ < auVar147._8_4_);
                  auVar51._4_4_ = auVar51._8_4_;
                  auVar51._0_4_ = auVar51._8_4_;
                  auVar51._12_4_ = auVar51._8_4_;
                  SVar103 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar147,auVar139,auVar51);
                  SVar91 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar139,auVar147,auVar51);
                  *local_1320 = SVar91;
                  local_1320[1] = SVar103;
                  sVar37 = auVar127._0_8_;
                  local_1320 = local_1320 + 2;
                }
                else {
                  lVar43 = 0;
                  if (uVar42 != 0) {
                    for (; (uVar42 >> lVar43 & 1) == 0; lVar43 = lVar43 + 1) {
                    }
                  }
                  auVar117._4_4_ = auVar118._8_4_;
                  auVar117._0_4_ = auVar118._8_4_;
                  auVar117._8_4_ = auVar118._8_4_;
                  auVar117._12_4_ = auVar118._8_4_;
                  auVar118 = blendvps(auVar127,auVar147,auVar117);
                  auVar139 = blendvps(auVar147,auVar127,auVar117);
                  auVar134._8_4_ = tNear.field_0.i[lVar43];
                  auVar134._0_8_ = *(undefined8 *)(uVar36 + lVar43 * 8);
                  auVar134._12_4_ = 0;
                  auVar52._8_4_ = -(uint)(iVar4 < tNear.field_0.i[lVar43]);
                  auVar52._4_4_ = auVar52._8_4_;
                  auVar52._0_4_ = auVar52._8_4_;
                  auVar52._12_4_ = auVar52._8_4_;
                  auVar127 = blendvps(auVar134,auVar135,auVar52);
                  auVar147 = blendvps(auVar135,auVar134,auVar52);
                  auVar53._8_4_ = -(uint)(auVar139._8_4_ < auVar147._8_4_);
                  auVar53._4_4_ = auVar53._8_4_;
                  auVar53._0_4_ = auVar53._8_4_;
                  auVar53._12_4_ = auVar53._8_4_;
                  auVar135 = blendvps(auVar147,auVar139,auVar53);
                  SVar91 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar139,auVar147,auVar53);
                  auVar54._8_4_ = -(uint)(auVar118._8_4_ < auVar127._8_4_);
                  auVar54._4_4_ = auVar54._8_4_;
                  auVar54._0_4_ = auVar54._8_4_;
                  auVar54._12_4_ = auVar54._8_4_;
                  auVar139 = blendvps(auVar127,auVar118,auVar54);
                  auVar147 = blendvps(auVar118,auVar127,auVar54);
                  auVar55._8_4_ = -(uint)(auVar147._8_4_ < auVar135._8_4_);
                  auVar55._4_4_ = auVar55._8_4_;
                  auVar55._0_4_ = auVar55._8_4_;
                  auVar55._12_4_ = auVar55._8_4_;
                  SVar128 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar135,auVar147,auVar55);
                  SVar103 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar147,auVar135,auVar55);
                  *local_1320 = SVar91;
                  local_1320[1] = SVar103;
                  local_1320[2] = SVar128;
                  sVar37 = auVar139._0_8_;
                  local_1320 = local_1320 + 3;
                }
              }
            }
          }
        }
        else {
          iVar29 = 6;
        }
      } while (iVar29 == 0);
    } while (iVar29 != 6);
    lVar43 = (ulong)((uint)sVar37 & 0xf) - 8;
    if (lVar43 != 0) {
      lVar46 = 0;
      do {
        lVar33 = lVar46 * 0x60;
        pSVar39 = context->scene;
        puVar1 = (uint *)(lVar33 + (sVar37 & 0xfffffffffffffff0));
        puVar45 = puVar1 + 0x10;
        ppfVar6 = (pSVar39->vertices).items;
        pfVar7 = ppfVar6[*puVar45];
        pfVar3 = pfVar7 + *puVar1;
        fVar164 = *pfVar3;
        fVar73 = pfVar3[1];
        fVar90 = pfVar3[2];
        pfVar3 = pfVar7 + puVar1[4];
        fVar125 = *pfVar3;
        fVar115 = pfVar3[1];
        fVar175 = pfVar3[2];
        uVar102 = *(undefined8 *)(pfVar7 + puVar1[8]);
        uVar22 = *(undefined8 *)(pfVar7 + puVar1[8] + 2);
        pfVar7 = pfVar7 + puVar1[0xc];
        fVar49 = *pfVar7;
        pfVar8 = ppfVar6[puVar1[0x11]];
        pfVar3 = pfVar8 + puVar1[1];
        fVar165 = *pfVar3;
        fVar83 = pfVar3[1];
        fVar94 = pfVar3[2];
        pfVar3 = pfVar8 + puVar1[5];
        fVar131 = *pfVar3;
        fVar121 = pfVar3[1];
        fVar176 = pfVar3[2];
        pfVar3 = pfVar8 + puVar1[9];
        fVar111 = *pfVar3;
        local_12a8._4_4_ = pfVar3[1];
        fVar179 = pfVar3[2];
        pfVar8 = pfVar8 + puVar1[0xd];
        fVar68 = *pfVar8;
        pfVar9 = ppfVar6[puVar1[0x12]];
        pfVar3 = pfVar9 + puVar1[2];
        fVar47 = *pfVar3;
        fVar66 = pfVar3[1];
        fVar69 = pfVar3[2];
        fVar71 = pfVar9[(ulong)puVar1[6] + 1];
        fStack_12a0 = pfVar9[(ulong)puVar1[10] + 1];
        uVar23 = *(undefined8 *)(pfVar9 + puVar1[0xe]);
        pfVar10 = ppfVar6[puVar1[0x13]];
        pfVar3 = pfVar10 + puVar1[3];
        fVar88 = *pfVar3;
        fVar92 = pfVar3[1];
        fVar95 = pfVar3[2];
        fVar97 = pfVar10[(ulong)puVar1[7] + 1];
        fStack_129c = pfVar10[(ulong)puVar1[0xb] + 1];
        pfVar3 = pfVar10 + puVar1[0xf];
        fVar84 = *pfVar3;
        fVar87 = pfVar3[1];
        local_1298._0_4_ = (float)uVar102;
        fVar101 = (float)local_1298;
        local_1298._4_4_ = (float)((ulong)uVar102 >> 0x20);
        uStack_1290._0_4_ = (float)uVar22;
        uVar102 = CONCAT44(fVar179,(float)uStack_1290);
        local_12a8 = (Scene *)CONCAT44(local_12a8._4_4_,local_1298._4_4_);
        local_11d8 = (float)uVar23;
        fStack_11d4 = (float)((ulong)uVar23 >> 0x20);
        fStack_11d0 = (float)*(undefined8 *)(pfVar9 + puVar1[0xe] + 2);
        fVar99 = fVar73 - fVar115;
        fVar109 = fVar83 - fVar121;
        fVar112 = fVar66 - fVar71;
        fVar113 = fVar92 - fVar97;
        fVar156 = fVar90 - fVar175;
        fVar158 = fVar94 - fVar176;
        fVar160 = fVar69 - pfVar9[(ulong)puVar1[6] + 2];
        fVar162 = fVar95 - pfVar10[(ulong)puVar1[7] + 2];
        fVar132 = pfVar7[1] - fVar73;
        fVar141 = pfVar8[1] - fVar83;
        fVar143 = fStack_11d4 - fVar66;
        fVar144 = fVar87 - fVar92;
        local_f88 = pfVar7[2];
        fStack_f84 = pfVar8[2];
        fStack_f80 = fStack_11d0;
        fStack_f7c = pfVar3[2];
        fVar151 = pfVar7[2] - fVar90;
        fVar154 = pfVar8[2] - fVar94;
        fStack_11d0 = fStack_11d0 - fVar69;
        fVar155 = pfVar3[2] - fVar95;
        fVar100 = fVar156 * fVar132 - fVar99 * fVar151;
        fVar110 = fVar158 * fVar141 - fVar109 * fVar154;
        fStack_12b0 = fVar160 * fVar143 - fVar112 * fStack_11d0;
        fStack_12ac = fVar162 * fVar144 - fVar113 * fVar155;
        fVar114 = fVar49 - fVar164;
        fVar120 = fVar68 - fVar165;
        fVar122 = local_11d8 - fVar47;
        fVar123 = fVar84 - fVar88;
        fVar150 = *(float *)(ray + k * 4);
        fVar145 = fVar164 - fVar150;
        fVar148 = fVar165 - fVar150;
        fVar149 = fVar47 - fVar150;
        fVar150 = fVar88 - fVar150;
        fVar170 = *(float *)(ray + k * 4 + 0x10);
        fVar73 = fVar73 - fVar170;
        fVar83 = fVar83 - fVar170;
        fVar66 = fVar66 - fVar170;
        fVar92 = fVar92 - fVar170;
        fVar170 = *(float *)(ray + k * 4 + 0x40);
        fVar133 = *(float *)(ray + k * 4 + 0x50);
        fVar171 = fVar145 * fVar133 - fVar73 * fVar170;
        fVar172 = fVar148 * fVar133 - fVar83 * fVar170;
        fVar173 = fVar149 * fVar133 - fVar66 * fVar170;
        fVar174 = fVar150 * fVar133 - fVar92 * fVar170;
        fVar164 = fVar164 - fVar125;
        fVar165 = fVar165 - fVar131;
        fVar47 = fVar47 - fStack_1240;
        fVar88 = fVar88 - fStack_123c;
        fVar124 = fVar164 * fVar151 - fVar156 * fVar114;
        fVar130 = fVar165 * fVar154 - fVar158 * fVar120;
        fStack_12c0 = fVar47 * fStack_11d0 - fVar160 * fVar122;
        fStack_12bc = fVar88 * fVar155 - fVar162 * fVar123;
        fVar142 = *(float *)(ray + k * 4 + 0x20);
        fVar90 = fVar90 - fVar142;
        fVar94 = fVar94 - fVar142;
        fVar69 = fVar69 - fVar142;
        fVar95 = fVar95 - fVar142;
        fVar142 = *(float *)(ray + k * 4 + 0x60);
        fVar177 = fVar90 * fVar170 - fVar145 * fVar142;
        fVar178 = fVar94 * fVar170 - fVar148 * fVar142;
        fVar180 = fVar69 * fVar170 - fVar149 * fVar142;
        fVar181 = fVar95 * fVar170 - fVar150 * fVar142;
        local_10d8[0] = fVar99 * fVar114 - fVar164 * fVar132;
        local_10d8[1] = fVar109 * fVar120 - fVar165 * fVar141;
        local_10d8[2] = fVar112 * fVar122 - fVar47 * fVar143;
        local_10d8[3] = fVar113 * fVar123 - fVar88 * fVar144;
        fVar157 = fVar73 * fVar142 - fVar90 * fVar133;
        fVar159 = fVar83 * fVar142 - fVar94 * fVar133;
        fVar161 = fVar66 * fVar142 - fVar69 * fVar133;
        fVar163 = fVar92 * fVar142 - fVar95 * fVar133;
        local_12b8 = CONCAT44(fVar110,fVar100);
        fVar166 = fVar170 * fVar100 + fVar133 * fVar124 + fVar142 * local_10d8[0];
        fVar168 = fVar170 * fVar110 + fVar133 * fVar130 + fVar142 * local_10d8[1];
        fVar169 = fVar170 * fStack_12b0 + fVar133 * fStack_12c0 + fVar142 * local_10d8[2];
        fVar170 = fVar170 * fStack_12ac + fVar133 * fStack_12bc + fVar142 * local_10d8[3];
        uVar67 = (uint)fVar166 & 0x80000000;
        uVar70 = (uint)fVar168 & 0x80000000;
        uVar72 = (uint)fVar169 & 0x80000000;
        uVar89 = (uint)fVar170 & 0x80000000;
        tNear.field_0.i[0] =
             (uint)(fVar114 * fVar157 + fVar132 * fVar177 + fVar151 * fVar171) ^ uVar67;
        tNear.field_0.i[1] =
             (uint)(fVar120 * fVar159 + fVar141 * fVar178 + fVar154 * fVar172) ^ uVar70;
        tNear.field_0.i[2] =
             (uint)(fVar122 * fVar161 + fVar143 * fVar180 + fStack_11d0 * fVar173) ^ uVar72;
        tNear.field_0.i[3] =
             (uint)(fVar123 * fVar163 + fVar144 * fVar181 + fVar155 * fVar174) ^ uVar89;
        fVar164 = (float)((uint)(fVar157 * fVar164 + fVar177 * fVar99 + fVar171 * fVar156) ^ uVar67)
        ;
        fVar165 = (float)((uint)(fVar159 * fVar165 + fVar178 * fVar109 + fVar172 * fVar158) ^ uVar70
                         );
        fVar47 = (float)((uint)(fVar161 * fVar47 + fVar180 * fVar112 + fVar173 * fVar160) ^ uVar72);
        fVar88 = (float)((uint)(fVar163 * fVar88 + fVar181 * fVar113 + fVar174 * fVar162) ^ uVar89);
        uStack_1290._4_4_ = (float)((ulong)uVar22 >> 0x20);
        fVar133 = ABS(fVar166);
        fVar142 = ABS(fVar168);
        auVar136._0_8_ = CONCAT44(fVar168,fVar166) & 0x7fffffff7fffffff;
        auVar136._8_4_ = ABS(fVar169);
        auVar136._12_4_ = ABS(fVar170);
        bVar19 = ((0.0 <= fVar164 && 0.0 <= tNear.field_0.v[0]) && fVar166 != 0.0) &&
                 tNear.field_0.v[0] + fVar164 <= fVar133;
        auVar152._0_4_ = -(uint)bVar19;
        bVar21 = ((0.0 <= fVar165 && 0.0 <= tNear.field_0.v[1]) && fVar168 != 0.0) &&
                 tNear.field_0.v[1] + fVar165 <= fVar142;
        auVar152._4_4_ = -(uint)bVar21;
        bVar20 = ((0.0 <= fVar47 && 0.0 <= tNear.field_0.v[2]) && fVar169 != 0.0) &&
                 tNear.field_0.v[2] + fVar47 <= auVar136._8_4_;
        auVar152._8_4_ = -(uint)bVar20;
        bVar18 = ((0.0 <= fVar88 && 0.0 <= tNear.field_0.v[3]) && fVar170 != 0.0) &&
                 tNear.field_0.v[3] + fVar88 <= auVar136._12_4_;
        auVar152._12_4_ = -(uint)bVar18;
        lVar2 = lVar33 + (sVar37 & 0xfffffffffffffff0);
        uVar32 = (undefined4)((ulong)lVar33 >> 0x20);
        uVar48 = movmskps((int)lVar33,auVar152);
        fVar170 = local_1298._4_4_;
        local_1298._0_4_ = (float)uStack_1290;
        if (uVar48 != 0) {
          fVar90 = (float)(uVar67 ^ (uint)(fVar145 * fVar100 +
                                          fVar73 * fVar124 + fVar90 * local_10d8[0]));
          fVar83 = (float)(uVar70 ^ (uint)(fVar148 * fVar110 +
                                          fVar83 * fVar130 + fVar94 * local_10d8[1]));
          fVar94 = (float)(uVar72 ^ (uint)(fVar149 * fStack_12b0 +
                                          fVar66 * fStack_12c0 + fVar69 * local_10d8[2]));
          fVar66 = (float)(uVar89 ^ (uint)(fVar150 * fStack_12ac +
                                          fVar92 * fStack_12bc + fVar95 * local_10d8[3]));
          fVar150 = *(float *)(ray + k * 4 + 0x30);
          fVar73 = *(float *)(ray + k * 4 + 0x80);
          bVar19 = (fVar150 * fVar133 < fVar90 && fVar90 <= fVar73 * fVar133) && bVar19;
          bVar21 = (fVar150 * fVar142 < fVar83 && fVar83 <= fVar73 * fVar142) && bVar21;
          valid.field_0._0_8_ = CONCAT44(-(uint)bVar21,-(uint)bVar19);
          bVar20 = (fVar150 * auVar136._8_4_ < fVar94 && fVar94 <= fVar73 * auVar136._8_4_) &&
                   bVar20;
          valid.field_0.i[2] = -(uint)bVar20;
          bVar18 = (fVar150 * auVar136._12_4_ < fVar66 && fVar66 <= fVar73 * auVar136._12_4_) &&
                   bVar18;
          valid.field_0.i[3] = -(uint)bVar18;
          uVar48 = movmskps(uVar48,(undefined1  [16])valid.field_0);
          if (uVar48 != 0) {
            local_10e8._4_4_ = fVar130;
            local_10e8._0_4_ = fVar124;
            fStack_10e0 = fStack_12c0;
            fStack_10dc = fStack_12bc;
            local_10c8._8_8_ = uStack_1000;
            local_10c8._0_8_ = local_1008;
            auVar139 = rcpps(auVar152,auVar136);
            fVar73 = auVar139._0_4_;
            fVar179 = auVar139._4_4_;
            fVar69 = auVar139._8_4_;
            fVar92 = auVar139._12_4_;
            fVar150 = DAT_01feca10._4_4_;
            fVar170 = DAT_01feca10._12_4_;
            fVar95 = (float)DAT_01feca10;
            fVar99 = DAT_01feca10._8_4_;
            fVar73 = (fVar95 - fVar133 * fVar73) * fVar73 + fVar73;
            fVar179 = (fVar150 - fVar142 * fVar179) * fVar179 + fVar179;
            fVar69 = (fVar99 - auVar136._8_4_ * fVar69) * fVar69 + fVar69;
            fVar92 = (fVar170 - auVar136._12_4_ * fVar92) * fVar92 + fVar92;
            fVar90 = fVar90 * fVar73;
            fVar83 = fVar83 * fVar179;
            fVar94 = fVar94 * fVar69;
            fVar66 = fVar66 * fVar92;
            local_1108[0] = fVar90;
            local_1108[1] = fVar83;
            local_1108[2] = fVar94;
            local_1108[3] = fVar66;
            auVar119._0_4_ = tNear.field_0.v[0] * fVar73;
            auVar119._4_4_ = tNear.field_0.v[1] * fVar179;
            auVar119._8_4_ = tNear.field_0.v[2] * fVar69;
            auVar119._12_4_ = tNear.field_0.v[3] * fVar92;
            auVar139 = minps(auVar119,_DAT_01feca10);
            auVar167._0_4_ = fVar73 * fVar164;
            auVar167._4_4_ = fVar179 * fVar165;
            auVar167._8_4_ = fVar69 * fVar47;
            auVar167._12_4_ = fVar92 * fVar88;
            auVar147 = minps(auVar167,_DAT_01feca10);
            auVar138._0_4_ = fVar95 - auVar139._0_4_;
            auVar138._4_4_ = fVar150 - auVar139._4_4_;
            auVar138._8_4_ = fVar99 - auVar139._8_4_;
            auVar138._12_4_ = fVar170 - auVar139._12_4_;
            auVar153._0_4_ = fVar95 - auVar147._0_4_;
            auVar153._4_4_ = fVar150 - auVar147._4_4_;
            auVar153._8_4_ = fVar99 - auVar147._8_4_;
            auVar153._12_4_ = fVar170 - auVar147._12_4_;
            local_1128 = blendvps(auVar139,auVar138,local_10c8);
            local_1118 = blendvps(auVar147,auVar153,local_10c8);
            local_10f8 = local_12b8;
            uStack_10f0 = CONCAT44(fStack_12ac,fStack_12b0);
            auVar56._8_4_ = valid.field_0.i[2];
            auVar56._0_8_ = valid.field_0._0_8_;
            auVar56._12_4_ = valid.field_0.i[3];
            auVar16._4_4_ = fVar83;
            auVar16._0_4_ = fVar90;
            auVar16._8_4_ = fVar94;
            auVar16._12_4_ = fVar66;
            auVar147 = blendvps(_DAT_01feb9f0,auVar16,auVar56);
            auVar74._4_4_ = auVar147._0_4_;
            auVar74._0_4_ = auVar147._4_4_;
            auVar74._8_4_ = auVar147._12_4_;
            auVar74._12_4_ = auVar147._8_4_;
            auVar139 = minps(auVar74,auVar147);
            auVar57._0_8_ = auVar139._8_8_;
            auVar57._8_4_ = auVar139._0_4_;
            auVar57._12_4_ = auVar139._4_4_;
            auVar139 = minps(auVar57,auVar139);
            auVar58._0_8_ =
                 CONCAT44(-(uint)(auVar139._4_4_ == auVar147._4_4_ && bVar21),
                          -(uint)(auVar139._0_4_ == auVar147._0_4_ && bVar19));
            auVar58._8_4_ = -(uint)(auVar139._8_4_ == auVar147._8_4_ && bVar20);
            auVar58._12_4_ = -(uint)(auVar139._12_4_ == auVar147._12_4_ && bVar18);
            iVar30 = movmskps(uVar48,auVar58);
            aVar104 = valid.field_0;
            if (iVar30 != 0) {
              aVar104.i[2] = auVar58._8_4_;
              aVar104._0_8_ = auVar58._0_8_;
              aVar104.i[3] = auVar58._12_4_;
            }
            uVar31 = movmskps(iVar30,(undefined1  [16])aVar104);
            uVar36 = 0;
            local_1298 = uVar102;
            uStack_1290 = uVar22;
            if (CONCAT44(uVar32,uVar31) != 0) {
              for (; (CONCAT44(uVar32,uVar31) >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
              }
            }
LAB_00285bbc:
            uVar48 = puVar45[uVar36];
            uVar42 = (ulong)uVar48;
            pGVar11 = (pSVar39->geometries).items[uVar42].ptr;
            if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              valid.field_0.v[uVar36] = 0.0;
LAB_00285ec6:
              uVar32 = (undefined4)(uVar42 >> 0x20);
              uVar48 = movmskps((int)uVar42,(undefined1  [16])valid.field_0);
              if (uVar48 == 0) goto LAB_002865a6;
              auVar17._4_4_ = fVar83;
              auVar17._0_4_ = fVar90;
              auVar17._8_4_ = fVar94;
              auVar17._12_4_ = fVar66;
              auVar147 = blendvps(_DAT_01feb9f0,auVar17,(undefined1  [16])valid.field_0);
              auVar105._4_4_ = auVar147._0_4_;
              auVar105._0_4_ = auVar147._4_4_;
              auVar105._8_4_ = auVar147._12_4_;
              auVar105._12_4_ = auVar147._8_4_;
              auVar139 = minps(auVar105,auVar147);
              auVar76._0_8_ = auVar139._8_8_;
              auVar76._8_4_ = auVar139._0_4_;
              auVar76._12_4_ = auVar139._4_4_;
              auVar139 = minps(auVar76,auVar139);
              auVar77._0_8_ =
                   CONCAT44(-(uint)(auVar139._4_4_ == auVar147._4_4_) & valid.field_0._4_4_,
                            -(uint)(auVar139._0_4_ == auVar147._0_4_) & valid.field_0._0_4_);
              auVar77._8_4_ = -(uint)(auVar139._8_4_ == auVar147._8_4_) & valid.field_0._8_4_;
              auVar77._12_4_ = -(uint)(auVar139._12_4_ == auVar147._12_4_) & valid.field_0._12_4_;
              iVar30 = movmskps(uVar48,auVar77);
              aVar60 = valid.field_0;
              if (iVar30 != 0) {
                aVar60.i[2] = auVar77._8_4_;
                aVar60._0_8_ = auVar77._0_8_;
                aVar60.i[3] = auVar77._12_4_;
              }
              uVar31 = movmskps(iVar30,(undefined1  [16])aVar60);
              uVar36 = 0;
              if (CONCAT44(uVar32,uVar31) != 0) {
                for (; (CONCAT44(uVar32,uVar31) >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                }
              }
              goto LAB_00285bbc;
            }
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
              local_1028 = fVar90;
              fStack_1024 = fVar83;
              fStack_1020 = fVar94;
              fStack_101c = fVar66;
              local_12c8 = (undefined4)lVar43;
              uStack_12c4 = (undefined4)((ulong)lVar43 >> 0x20);
              local_1088 = *(undefined4 *)(local_1128 + uVar36 * 4);
              local_1078 = local_1108[uVar36 - 4];
              local_10b8._4_4_ = *(undefined4 *)((long)&local_10f8 + uVar36 * 4);
              local_10a8._4_4_ = local_10d8[uVar36 - 4];
              local_1058._4_4_ = uVar48;
              local_1058._0_4_ = uVar48;
              local_1058._8_4_ = uVar48;
              local_1058._12_4_ = uVar48;
              uVar32 = *(undefined4 *)(lVar2 + 0x50 + uVar36 * 4);
              local_1068._4_4_ = uVar32;
              local_1068._0_4_ = uVar32;
              local_1068._8_4_ = uVar32;
              local_1068._12_4_ = uVar32;
              fVar150 = local_10d8[uVar36];
              local_1098._4_4_ = fVar150;
              local_1098._0_4_ = fVar150;
              local_1098._8_4_ = fVar150;
              local_1098._12_4_ = fVar150;
              local_10b8._0_4_ = local_10b8._4_4_;
              local_10b8._8_4_ = local_10b8._4_4_;
              local_10b8._12_4_ = local_10b8._4_4_;
              local_10a8._0_4_ = local_10a8._4_4_;
              fStack_10a0 = (float)local_10a8._4_4_;
              fStack_109c = (float)local_10a8._4_4_;
              uStack_1084 = local_1088;
              uStack_1080 = local_1088;
              uStack_107c = local_1088;
              fStack_1074 = local_1078;
              fStack_1070 = local_1078;
              fStack_106c = local_1078;
              local_1048 = context->user->instID[0];
              uStack_1044 = local_1048;
              uStack_1040 = local_1048;
              uStack_103c = local_1048;
              local_1038 = context->user->instPrimID[0];
              uStack_1034 = local_1038;
              uStack_1030 = local_1038;
              uStack_102c = local_1038;
              local_12cc = *(undefined4 *)(ray + k * 4 + 0x80);
              *(float *)(ray + k * 4 + 0x80) = local_1108[uVar36];
              local_12e8 = *(undefined8 *)(mm_lookupmask_ps + lVar35);
              uStack_12e0 = *(undefined8 *)(mm_lookupmask_ps + lVar35 + 8);
              args.valid = (int *)&local_12e8;
              args.geometryUserPtr = pGVar11->userPtr;
              args.context = context->user;
              args.hit = (RTCHitN *)local_10b8;
              args.N = 4;
              local_12b8 = uVar41;
              args.ray = (RTCRayN *)ray;
              if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar11->intersectionFilterN)(&args);
              }
              auVar24._8_8_ = uStack_12e0;
              auVar24._0_8_ = local_12e8;
              if (auVar24 == (undefined1  [16])0x0) {
                auVar75._8_4_ = 0xffffffff;
                auVar75._0_8_ = 0xffffffffffffffff;
                auVar75._12_4_ = 0xffffffff;
                auVar75 = auVar75 ^ _DAT_01febe20;
              }
              else {
                p_Var12 = context->args->filter;
                if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var12)(&args);
                }
                auVar25._8_8_ = uStack_12e0;
                auVar25._0_8_ = local_12e8;
                auVar59._0_4_ = -(uint)((int)local_12e8 == 0);
                auVar59._4_4_ = -(uint)((int)((ulong)local_12e8 >> 0x20) == 0);
                auVar59._8_4_ = -(uint)((int)uStack_12e0 == 0);
                auVar59._12_4_ = -(uint)((int)((ulong)uStack_12e0 >> 0x20) == 0);
                auVar75 = auVar59 ^ _DAT_01febe20;
                if (auVar25 != (undefined1  [16])0x0) {
                  auVar139 = blendvps(*(undefined1 (*) [16])args.hit,
                                      *(undefined1 (*) [16])(args.ray + 0xc0),auVar59);
                  *(undefined1 (*) [16])(args.ray + 0xc0) = auVar139;
                  auVar139 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                      *(undefined1 (*) [16])(args.ray + 0xd0),auVar59);
                  *(undefined1 (*) [16])(args.ray + 0xd0) = auVar139;
                  auVar139 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                      *(undefined1 (*) [16])(args.ray + 0xe0),auVar59);
                  *(undefined1 (*) [16])(args.ray + 0xe0) = auVar139;
                  auVar139 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                      *(undefined1 (*) [16])(args.ray + 0xf0),auVar59);
                  *(undefined1 (*) [16])(args.ray + 0xf0) = auVar139;
                  auVar139 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                      *(undefined1 (*) [16])(args.ray + 0x100),auVar59);
                  *(undefined1 (*) [16])(args.ray + 0x100) = auVar139;
                  auVar139 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                      *(undefined1 (*) [16])(args.ray + 0x110),auVar59);
                  *(undefined1 (*) [16])(args.ray + 0x110) = auVar139;
                  auVar139 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                      *(undefined1 (*) [16])(args.ray + 0x120),auVar59);
                  *(undefined1 (*) [16])(args.ray + 0x120) = auVar139;
                  auVar139 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                      *(undefined1 (*) [16])(args.ray + 0x130),auVar59);
                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar139;
                  auVar139 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                      *(undefined1 (*) [16])(args.ray + 0x140),auVar59);
                  *(undefined1 (*) [16])(args.ray + 0x140) = auVar139;
                }
              }
              if ((_DAT_01fecb20 & auVar75) == (undefined1  [16])0x0) {
                *(undefined4 *)(ray + k * 4 + 0x80) = local_12cc;
              }
              valid.field_0.v[uVar36] = 0.0;
              fVar150 = *(float *)(ray + k * 4 + 0x80);
              valid.field_0.i[1] = -(uint)(fStack_1024 <= fVar150) & valid.field_0.i[1];
              valid.field_0.i[0] = -(uint)(local_1028 <= fVar150) & valid.field_0.i[0];
              valid.field_0.i[2] = -(uint)(fStack_1020 <= fVar150) & valid.field_0.i[2];
              valid.field_0.i[3] = -(uint)(fStack_101c <= fVar150) & valid.field_0.i[3];
              lVar43 = CONCAT44(uStack_12c4,local_12c8);
              uVar42 = uVar36;
              uVar41 = local_12b8;
              fVar90 = local_1028;
              fVar83 = fStack_1024;
              fVar94 = fStack_1020;
              fVar66 = fStack_101c;
              goto LAB_00285ec6;
            }
            uVar32 = *(undefined4 *)(local_1128 + uVar36 * 4);
            fVar150 = local_1108[uVar36 - 4];
            *(float *)(ray + k * 4 + 0x80) = local_1108[uVar36];
            *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)&local_10f8 + uVar36 * 4);
            *(float *)(ray + k * 4 + 0xd0) = local_10d8[uVar36 - 4];
            *(float *)(ray + k * 4 + 0xe0) = local_10d8[uVar36];
            *(undefined4 *)(ray + k * 4 + 0xf0) = uVar32;
            *(float *)(ray + k * 4 + 0x100) = fVar150;
            *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar2 + 0x50 + uVar36 * 4);
            *(uint *)(ray + k * 4 + 0x120) = uVar48;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            uVar48 = context->user->instPrimID[0];
            uVar32 = 0;
            *(uint *)(ray + k * 4 + 0x140) = uVar48;
LAB_002865a6:
            fVar170 = (float)local_12a8;
            fVar179 = local_1298._4_4_;
          }
        }
        fVar49 = fVar101 - fVar49;
        fVar68 = fVar111 - fVar68;
        fStack_11f0 = fStack_1230 - fStack_11f0;
        fStack_11ec = fStack_122c - fStack_11ec;
        local_11d8 = fVar170 - local_11d8;
        fVar84 = local_12a8._4_4_ - fVar84;
        fStack_11d4 = fStack_12a0 - fStack_11d4;
        fVar87 = fStack_129c - fVar87;
        fVar92 = (float)local_1298 - local_f88;
        fVar95 = fVar179 - fStack_f84;
        fVar99 = (float)uStack_1290 - fStack_f80;
        fVar100 = uStack_1290._4_4_ - fStack_f7c;
        fVar125 = fVar125 - fVar101;
        fVar131 = fVar131 - fVar111;
        fVar66 = fStack_1240 - fStack_1230;
        fVar69 = fStack_123c - fStack_122c;
        fVar115 = fVar115 - fVar170;
        fVar121 = fVar121 - local_12a8._4_4_;
        fVar71 = fVar71 - fStack_12a0;
        fVar97 = fVar97 - fStack_129c;
        fVar175 = fVar175 - (float)local_1298;
        fVar176 = fVar176 - fVar179;
        fVar141 = fStack_1200 - (float)uStack_1290;
        fVar143 = fStack_11fc - uStack_1290._4_4_;
        fVar165 = fVar115 * fVar92 - fVar175 * local_11d8;
        fVar83 = fVar121 * fVar95 - fVar176 * fVar84;
        fVar94 = fVar71 * fVar99 - fVar141 * fStack_11d4;
        fVar47 = fVar97 * fVar100 - fVar143 * fVar87;
        local_10e8._0_4_ = fVar175 * fVar49 - fVar125 * fVar92;
        local_10e8._4_4_ = fVar176 * fVar68 - fVar131 * fVar95;
        fStack_10e0 = fVar141 * fStack_11f0 - fVar66 * fVar99;
        fStack_10dc = fVar143 * fStack_11ec - fVar69 * fVar100;
        local_10d8[0] = fVar125 * local_11d8 - fVar115 * fVar49;
        local_10d8[1] = fVar131 * fVar84 - fVar121 * fVar68;
        local_10d8[2] = fVar66 * fStack_11d4 - fVar71 * fStack_11f0;
        local_10d8[3] = fVar69 * fVar87 - fVar97 * fStack_11ec;
        fVar150 = *(float *)(ray + k * 4);
        fVar133 = *(float *)(ray + k * 4 + 0x10);
        fVar142 = *(float *)(ray + k * 4 + 0x20);
        fVar164 = *(float *)(ray + k * 4 + 0x40);
        fVar73 = *(float *)(ray + k * 4 + 0x50);
        fVar90 = *(float *)(ray + k * 4 + 0x60);
        fVar101 = fVar101 - fVar150;
        fVar111 = fVar111 - fVar150;
        fStack_1230 = fStack_1230 - fVar150;
        fStack_122c = fStack_122c - fVar150;
        fVar170 = fVar170 - fVar133;
        local_12a8._4_4_ = local_12a8._4_4_ - fVar133;
        fStack_12a0 = fStack_12a0 - fVar133;
        fStack_129c = fStack_129c - fVar133;
        local_1298._0_4_ = (float)local_1298 - fVar142;
        fVar179 = fVar179 - fVar142;
        uStack_1290._0_4_ = (float)uStack_1290 - fVar142;
        uStack_1290._4_4_ = uStack_1290._4_4_ - fVar142;
        fVar150 = fVar170 * fVar90 - (float)local_1298 * fVar73;
        fVar133 = local_12a8._4_4_ * fVar90 - fVar179 * fVar73;
        fVar142 = fStack_12a0 * fVar90 - (float)uStack_1290 * fVar73;
        fVar88 = fStack_129c * fVar90 - uStack_1290._4_4_ * fVar73;
        fVar113 = (float)local_1298 * fVar164 - fVar101 * fVar90;
        fVar114 = fVar179 * fVar164 - fVar111 * fVar90;
        fVar120 = (float)uStack_1290 * fVar164 - fStack_1230 * fVar90;
        fVar122 = uStack_1290._4_4_ * fVar164 - fStack_122c * fVar90;
        fVar123 = fVar101 * fVar73 - fVar170 * fVar164;
        fVar124 = fVar111 * fVar73 - local_12a8._4_4_ * fVar164;
        fVar130 = fStack_1230 * fVar73 - fStack_12a0 * fVar164;
        fVar132 = fStack_122c * fVar73 - fStack_129c * fVar164;
        fVar109 = fVar164 * fVar165 + fVar73 * (float)local_10e8._0_4_ + fVar90 * local_10d8[0];
        fVar110 = fVar164 * fVar83 + fVar73 * (float)local_10e8._4_4_ + fVar90 * local_10d8[1];
        fVar112 = fVar164 * fVar94 + fVar73 * fStack_10e0 + fVar90 * local_10d8[2];
        fVar73 = fVar164 * fVar47 + fVar73 * fStack_10dc + fVar90 * local_10d8[3];
        uVar67 = (uint)fVar109 & 0x80000000;
        uVar70 = (uint)fVar110 & 0x80000000;
        uVar72 = (uint)fVar112 & 0x80000000;
        uVar89 = (uint)fVar73 & 0x80000000;
        tNear.field_0.i[0] =
             (uint)(fVar125 * fVar150 + fVar115 * fVar113 + fVar175 * fVar123) ^ uVar67;
        tNear.field_0.i[1] =
             (uint)(fVar131 * fVar133 + fVar121 * fVar114 + fVar176 * fVar124) ^ uVar70;
        tNear.field_0.i[2] =
             (uint)(fVar66 * fVar142 + fVar71 * fVar120 + fVar141 * fVar130) ^ uVar72;
        tNear.field_0.i[3] = (uint)(fVar69 * fVar88 + fVar97 * fVar122 + fVar143 * fVar132) ^ uVar89
        ;
        fVar150 = (float)((uint)(fVar150 * fVar49 + fVar113 * local_11d8 + fVar123 * fVar92) ^
                         uVar67);
        fVar133 = (float)((uint)(fVar133 * fVar68 + fVar114 * fVar84 + fVar124 * fVar95) ^ uVar70);
        fVar142 = (float)((uint)(fVar142 * fStack_11f0 + fVar120 * fStack_11d4 + fVar130 * fVar99) ^
                         uVar72);
        fVar164 = (float)((uint)(fVar88 * fStack_11ec + fVar122 * fVar87 + fVar132 * fVar100) ^
                         uVar89);
        fVar90 = ABS(fVar109);
        fVar125 = ABS(fVar110);
        fVar115 = ABS(fVar112);
        fVar175 = ABS(fVar73);
        bVar20 = tNear.field_0.v[0] + fVar150 <= fVar90 &&
                 ((0.0 <= fVar150 && 0.0 <= tNear.field_0.v[0]) && fVar109 != 0.0);
        auVar137._0_4_ = -(uint)bVar20;
        bVar21 = tNear.field_0.v[1] + fVar133 <= fVar125 &&
                 ((0.0 <= fVar133 && 0.0 <= tNear.field_0.v[1]) && fVar110 != 0.0);
        auVar137._4_4_ = -(uint)bVar21;
        bVar19 = tNear.field_0.v[2] + fVar142 <= fVar115 &&
                 ((0.0 <= fVar142 && 0.0 <= tNear.field_0.v[2]) && fVar112 != 0.0);
        auVar137._8_4_ = -(uint)bVar19;
        bVar18 = tNear.field_0.v[3] + fVar164 <= fVar175 &&
                 ((0.0 <= fVar164 && 0.0 <= tNear.field_0.v[3]) && fVar73 != 0.0);
        auVar137._12_4_ = -(uint)bVar18;
        iVar30 = movmskps(uVar48,auVar137);
        if (iVar30 != 0) {
          fVar49 = (float)(uVar67 ^ (uint)(fVar101 * fVar165 +
                                          fVar170 * (float)local_10e8._0_4_ +
                                          (float)local_1298 * local_10d8[0]));
          fVar131 = (float)(uVar70 ^ (uint)(fVar111 * fVar83 +
                                           local_12a8._4_4_ * (float)local_10e8._4_4_ +
                                           fVar179 * local_10d8[1]));
          fVar121 = (float)(uVar72 ^ (uint)(fStack_1230 * fVar94 +
                                           fStack_12a0 * fStack_10e0 +
                                           (float)uStack_1290 * local_10d8[2]));
          fVar176 = (float)(uVar89 ^ (uint)(fStack_122c * fVar47 +
                                           fStack_129c * fStack_10dc +
                                           uStack_1290._4_4_ * local_10d8[3]));
          fVar170 = *(float *)(ray + k * 4 + 0x30);
          fVar73 = *(float *)(ray + k * 4 + 0x80);
          bVar20 = (fVar49 <= fVar73 * fVar90 && fVar170 * fVar90 < fVar49) && bVar20;
          bVar21 = (fVar131 <= fVar73 * fVar125 && fVar170 * fVar125 < fVar131) && bVar21;
          valid.field_0._0_8_ = CONCAT44(-(uint)bVar21,-(uint)bVar20);
          bVar19 = (fVar121 <= fVar73 * fVar115 && fVar170 * fVar115 < fVar121) && bVar19;
          valid.field_0.i[2] = -(uint)bVar19;
          bVar18 = (fVar176 <= fVar73 * fVar175 && fVar170 * fVar175 < fVar176) && bVar18;
          valid.field_0.i[3] = -(uint)bVar18;
          iVar30 = movmskps(iVar30,(undefined1  [16])valid.field_0);
          if (iVar30 != 0) {
            local_10c8._8_8_ = uStack_1010;
            local_10c8._0_8_ = local_1018;
            pSVar39 = context->scene;
            auVar15._4_4_ = fVar125;
            auVar15._0_4_ = fVar90;
            auVar15._8_4_ = fVar115;
            auVar15._12_4_ = fVar175;
            auVar139 = rcpps(auVar137,auVar15);
            fVar111 = auVar139._0_4_;
            fVar179 = auVar139._4_4_;
            fVar68 = auVar139._8_4_;
            fVar66 = auVar139._12_4_;
            fVar170 = DAT_01feca10._4_4_;
            fVar73 = DAT_01feca10._12_4_;
            fVar69 = (float)DAT_01feca10;
            fVar71 = DAT_01feca10._8_4_;
            fVar111 = (fVar69 - fVar90 * fVar111) * fVar111 + fVar111;
            fVar179 = (fVar170 - fVar125 * fVar179) * fVar179 + fVar179;
            fVar68 = (fVar71 - fVar115 * fVar68) * fVar68 + fVar68;
            fVar66 = (fVar73 - fVar175 * fVar66) * fVar66 + fVar66;
            fVar49 = fVar49 * fVar111;
            fVar131 = fVar131 * fVar179;
            fVar121 = fVar121 * fVar68;
            fVar176 = fVar176 * fVar66;
            local_1108[0] = fVar49;
            local_1108[1] = fVar131;
            local_1108[2] = fVar121;
            local_1108[3] = fVar176;
            auVar106._0_4_ = tNear.field_0.v[0] * fVar111;
            auVar106._4_4_ = tNear.field_0.v[1] * fVar179;
            auVar106._8_4_ = tNear.field_0.v[2] * fVar68;
            auVar106._12_4_ = tNear.field_0.v[3] * fVar66;
            auVar139 = minps(auVar106,_DAT_01feca10);
            auVar146._0_4_ = fVar111 * fVar150;
            auVar146._4_4_ = fVar179 * fVar133;
            auVar146._8_4_ = fVar68 * fVar142;
            auVar146._12_4_ = fVar66 * fVar164;
            auVar147 = minps(auVar146,_DAT_01feca10);
            auVar129._0_4_ = fVar69 - auVar139._0_4_;
            auVar129._4_4_ = fVar170 - auVar139._4_4_;
            auVar129._8_4_ = fVar71 - auVar139._8_4_;
            auVar129._12_4_ = fVar73 - auVar139._12_4_;
            auVar140._0_4_ = fVar69 - auVar147._0_4_;
            auVar140._4_4_ = fVar170 - auVar147._4_4_;
            auVar140._8_4_ = fVar71 - auVar147._8_4_;
            auVar140._12_4_ = fVar73 - auVar147._12_4_;
            local_1128 = blendvps(auVar139,auVar129,local_10c8);
            local_1118 = blendvps(auVar147,auVar140,local_10c8);
            local_10f8 = CONCAT44(fVar83,fVar165);
            uStack_10f0 = CONCAT44(fVar47,fVar94);
            auVar61._8_4_ = valid.field_0.i[2];
            auVar61._0_8_ = valid.field_0._0_8_;
            auVar61._12_4_ = valid.field_0.i[3];
            auVar13._4_4_ = fVar131;
            auVar13._0_4_ = fVar49;
            auVar13._8_4_ = fVar121;
            auVar13._12_4_ = fVar176;
            auVar147 = blendvps(_DAT_01feb9f0,auVar13,auVar61);
            auVar107._4_4_ = auVar147._0_4_;
            auVar107._0_4_ = auVar147._4_4_;
            auVar107._8_4_ = auVar147._12_4_;
            auVar107._12_4_ = auVar147._8_4_;
            auVar139 = minps(auVar107,auVar147);
            auVar62._0_8_ = auVar139._8_8_;
            auVar62._8_4_ = auVar139._0_4_;
            auVar62._12_4_ = auVar139._4_4_;
            auVar139 = minps(auVar62,auVar139);
            auVar63._0_8_ =
                 CONCAT44(-(uint)(auVar139._4_4_ == auVar147._4_4_ && bVar21),
                          -(uint)(auVar139._0_4_ == auVar147._0_4_ && bVar20));
            auVar63._8_4_ = -(uint)(auVar139._8_4_ == auVar147._8_4_ && bVar19);
            auVar63._12_4_ = -(uint)(auVar139._12_4_ == auVar147._12_4_ && bVar18);
            iVar30 = movmskps(iVar30,auVar63);
            aVar78 = valid.field_0;
            if (iVar30 != 0) {
              aVar78.i[2] = auVar63._8_4_;
              aVar78._0_8_ = auVar63._0_8_;
              aVar78.i[3] = auVar63._12_4_;
            }
            uVar31 = movmskps(iVar30,(undefined1  [16])aVar78);
            uVar36 = 0;
            if (CONCAT44(uVar32,uVar31) != 0) {
              for (; (CONCAT44(uVar32,uVar31) >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
              }
            }
LAB_00286115:
            uVar48 = puVar45[uVar36];
            uVar42 = (ulong)uVar48;
            pGVar11 = (pSVar39->geometries).items[uVar42].ptr;
            if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              valid.field_0.v[uVar36] = 0.0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar32 = *(undefined4 *)(local_1128 + uVar36 * 4);
                fVar150 = local_1108[uVar36 - 4];
                *(float *)(ray + k * 4 + 0x80) = local_1108[uVar36];
                *(undefined4 *)(ray + k * 4 + 0xc0) =
                     *(undefined4 *)((long)&local_10f8 + uVar36 * 4);
                *(float *)(ray + k * 4 + 0xd0) = local_10d8[uVar36 - 4];
                *(float *)(ray + k * 4 + 0xe0) = local_10d8[uVar36];
                *(undefined4 *)(ray + k * 4 + 0xf0) = uVar32;
                *(float *)(ray + k * 4 + 0x100) = fVar150;
                *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar2 + 0x50 + uVar36 * 4);
                *(uint *)(ray + k * 4 + 0x120) = uVar48;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                goto LAB_00285a19;
              }
              local_1298 = CONCAT44(fVar131,fVar49);
              uStack_1290 = CONCAT44(fVar176,fVar121);
              local_12c8 = (undefined4)lVar43;
              uStack_12c4 = (undefined4)((ulong)lVar43 >> 0x20);
              local_1088 = *(undefined4 *)(local_1128 + uVar36 * 4);
              local_1078 = local_1108[uVar36 - 4];
              uVar32 = *(undefined4 *)((long)&local_10f8 + uVar36 * 4);
              fVar150 = local_10d8[uVar36 - 4];
              local_1058._4_4_ = uVar48;
              local_1058._0_4_ = uVar48;
              local_1058._8_4_ = uVar48;
              local_1058._12_4_ = uVar48;
              uVar31 = *(undefined4 *)(lVar2 + 0x50 + uVar36 * 4);
              local_1068._4_4_ = uVar31;
              local_1068._0_4_ = uVar31;
              local_1068._8_4_ = uVar31;
              local_1068._12_4_ = uVar31;
              local_10b8._4_4_ = uVar32;
              local_10b8._0_4_ = uVar32;
              local_10b8._8_4_ = uVar32;
              local_10b8._12_4_ = uVar32;
              local_10a8._4_4_ = fVar150;
              local_10a8._0_4_ = fVar150;
              fStack_10a0 = fVar150;
              fStack_109c = fVar150;
              fVar150 = local_10d8[uVar36];
              local_1098._4_4_ = fVar150;
              local_1098._0_4_ = fVar150;
              local_1098._8_4_ = fVar150;
              local_1098._12_4_ = fVar150;
              uStack_1084 = local_1088;
              uStack_1080 = local_1088;
              uStack_107c = local_1088;
              fStack_1074 = local_1078;
              fStack_1070 = local_1078;
              fStack_106c = local_1078;
              local_1048 = context->user->instID[0];
              uStack_1044 = local_1048;
              uStack_1040 = local_1048;
              uStack_103c = local_1048;
              local_1038 = context->user->instPrimID[0];
              uStack_1034 = local_1038;
              uStack_1030 = local_1038;
              uStack_102c = local_1038;
              uVar32 = *(undefined4 *)(ray + k * 4 + 0x80);
              *(float *)(ray + k * 4 + 0x80) = local_1108[uVar36];
              local_12e8 = *(undefined8 *)(mm_lookupmask_ps + lVar35);
              uStack_12e0 = *(undefined8 *)(mm_lookupmask_ps + lVar35 + 8);
              args.valid = (int *)&local_12e8;
              args.geometryUserPtr = pGVar11->userPtr;
              args.context = context->user;
              args.hit = (RTCHitN *)local_10b8;
              args.N = 4;
              local_12b8 = uVar41;
              local_12a8 = pSVar39;
              args.ray = (RTCRayN *)ray;
              if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar11->intersectionFilterN)(&args);
              }
              auVar26._8_8_ = uStack_12e0;
              auVar26._0_8_ = local_12e8;
              if (auVar26 == (undefined1  [16])0x0) {
                auVar79._8_4_ = 0xffffffff;
                auVar79._0_8_ = 0xffffffffffffffff;
                auVar79._12_4_ = 0xffffffff;
                auVar79 = auVar79 ^ _DAT_01febe20;
              }
              else {
                p_Var12 = context->args->filter;
                if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var12)(&args);
                }
                auVar27._8_8_ = uStack_12e0;
                auVar27._0_8_ = local_12e8;
                auVar64._0_4_ = -(uint)((int)local_12e8 == 0);
                auVar64._4_4_ = -(uint)((int)((ulong)local_12e8 >> 0x20) == 0);
                auVar64._8_4_ = -(uint)((int)uStack_12e0 == 0);
                auVar64._12_4_ = -(uint)((int)((ulong)uStack_12e0 >> 0x20) == 0);
                auVar79 = auVar64 ^ _DAT_01febe20;
                if (auVar27 != (undefined1  [16])0x0) {
                  auVar139 = blendvps(*(undefined1 (*) [16])args.hit,
                                      *(undefined1 (*) [16])(args.ray + 0xc0),auVar64);
                  *(undefined1 (*) [16])(args.ray + 0xc0) = auVar139;
                  auVar139 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                      *(undefined1 (*) [16])(args.ray + 0xd0),auVar64);
                  *(undefined1 (*) [16])(args.ray + 0xd0) = auVar139;
                  auVar139 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                      *(undefined1 (*) [16])(args.ray + 0xe0),auVar64);
                  *(undefined1 (*) [16])(args.ray + 0xe0) = auVar139;
                  auVar139 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                      *(undefined1 (*) [16])(args.ray + 0xf0),auVar64);
                  *(undefined1 (*) [16])(args.ray + 0xf0) = auVar139;
                  auVar139 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                      *(undefined1 (*) [16])(args.ray + 0x100),auVar64);
                  *(undefined1 (*) [16])(args.ray + 0x100) = auVar139;
                  auVar139 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                      *(undefined1 (*) [16])(args.ray + 0x110),auVar64);
                  *(undefined1 (*) [16])(args.ray + 0x110) = auVar139;
                  auVar139 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                      *(undefined1 (*) [16])(args.ray + 0x120),auVar64);
                  *(undefined1 (*) [16])(args.ray + 0x120) = auVar139;
                  auVar139 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                      *(undefined1 (*) [16])(args.ray + 0x130),auVar64);
                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar139;
                  auVar139 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                      *(undefined1 (*) [16])(args.ray + 0x140),auVar64);
                  *(undefined1 (*) [16])(args.ray + 0x140) = auVar139;
                }
              }
              if ((_DAT_01fecb20 & auVar79) == (undefined1  [16])0x0) {
                *(undefined4 *)(ray + k * 4 + 0x80) = uVar32;
              }
              valid.field_0.v[uVar36] = 0.0;
              fVar150 = *(float *)(ray + k * 4 + 0x80);
              valid.field_0.i[1] = -(uint)(local_1298._4_4_ <= fVar150) & valid.field_0.i[1];
              valid.field_0.i[0] = -(uint)((float)local_1298 <= fVar150) & valid.field_0.i[0];
              valid.field_0.i[2] = -(uint)((float)uStack_1290 <= fVar150) & valid.field_0.i[2];
              valid.field_0.i[3] = -(uint)(uStack_1290._4_4_ <= fVar150) & valid.field_0.i[3];
              lVar43 = CONCAT44(uStack_12c4,local_12c8);
              uVar42 = uVar36;
              pSVar39 = local_12a8;
              uVar41 = local_12b8;
              fVar49 = (float)local_1298;
              fVar131 = local_1298._4_4_;
              fVar121 = (float)uStack_1290;
              fVar176 = uStack_1290._4_4_;
            }
            iVar30 = movmskps((int)uVar42,(undefined1  [16])valid.field_0);
            if (iVar30 == 0) goto LAB_00285a19;
            auVar14._4_4_ = fVar131;
            auVar14._0_4_ = fVar49;
            auVar14._8_4_ = fVar121;
            auVar14._12_4_ = fVar176;
            auVar147 = blendvps(_DAT_01feb9f0,auVar14,(undefined1  [16])valid.field_0);
            auVar108._4_4_ = auVar147._0_4_;
            auVar108._0_4_ = auVar147._4_4_;
            auVar108._8_4_ = auVar147._12_4_;
            auVar108._12_4_ = auVar147._8_4_;
            auVar139 = minps(auVar108,auVar147);
            auVar80._0_8_ = auVar139._8_8_;
            auVar80._8_4_ = auVar139._0_4_;
            auVar80._12_4_ = auVar139._4_4_;
            auVar139 = minps(auVar80,auVar139);
            auVar81._0_8_ =
                 CONCAT44(-(uint)(auVar139._4_4_ == auVar147._4_4_) & valid.field_0._4_4_,
                          -(uint)(auVar139._0_4_ == auVar147._0_4_) & valid.field_0._0_4_);
            auVar81._8_4_ = -(uint)(auVar139._8_4_ == auVar147._8_4_) & valid.field_0._8_4_;
            auVar81._12_4_ = -(uint)(auVar139._12_4_ == auVar147._12_4_) & valid.field_0._12_4_;
            iVar30 = movmskps(iVar30,auVar81);
            aVar65 = valid.field_0;
            if (iVar30 != 0) {
              aVar65.i[2] = auVar81._8_4_;
              aVar65._0_8_ = auVar81._0_8_;
              aVar65.i[3] = auVar81._12_4_;
            }
            uVar32 = movmskps(iVar30,(undefined1  [16])aVar65);
            uVar42 = CONCAT44((int)(uVar42 >> 0x20),uVar32);
            uVar36 = 0;
            if (uVar42 != 0) {
              for (; (uVar42 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
              }
            }
            goto LAB_00286115;
          }
        }
LAB_00285a19:
        lVar46 = lVar46 + 1;
      } while (lVar46 != lVar43);
    }
    iVar30 = *(int *)(ray + k * 4 + 0x80);
    iVar82 = iVar30;
    iVar85 = iVar30;
    iVar86 = iVar30;
    fVar150 = local_fe8;
    fVar170 = fStack_fe4;
    fVar133 = fStack_fe0;
    fVar142 = fStack_fdc;
    fVar164 = local_ff8;
    fVar73 = fStack_ff4;
    fVar90 = fStack_ff0;
    fVar125 = fStack_fec;
    fVar115 = local_fc8;
    fVar175 = fStack_fc4;
    fVar49 = fStack_fc0;
    fVar165 = fStack_fbc;
    fVar83 = local_fd8;
    fVar94 = fStack_fd4;
    fVar131 = fStack_fd0;
    fVar121 = fStack_fcc;
    fVar176 = local_fb8;
    fVar111 = fStack_fb4;
    fVar179 = fStack_fb0;
    fVar68 = fStack_fac;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }